

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::BitState<unsigned_long>,long,duckdb::BitXorOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  ulong *puVar2;
  byte *pbVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  char *pcVar6;
  data_ptr_t pdVar7;
  data_ptr_t pdVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t iVar14;
  idx_t iVar15;
  idx_t iVar16;
  ulong uVar17;
  ulong uVar18;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      pdVar7 = input->data;
      pdVar8 = states->data;
      FlatVector::VerifyFlatVector(input);
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        if (count == 0) {
          return;
        }
        iVar14 = 0;
        do {
          pcVar6 = *(char **)(pdVar8 + iVar14 * 8);
          uVar11 = *(ulong *)(pdVar7 + iVar14 * 8);
          if (*pcVar6 == '\0') {
            *pcVar6 = '\x01';
          }
          else {
            uVar11 = uVar11 ^ *(ulong *)(pcVar6 + 8);
          }
          *(ulong *)(pcVar6 + 8) = uVar11;
          iVar14 = iVar14 + 1;
        } while (count != iVar14);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar10 = 0;
      uVar11 = 0;
      do {
        uVar17 = puVar1[uVar10];
        uVar12 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar12 = count;
        }
        uVar13 = uVar12;
        if (uVar17 != 0) {
          uVar13 = uVar11;
          if (uVar17 == 0xffffffffffffffff) {
            if (uVar11 < uVar12) {
              do {
                pcVar6 = *(char **)(pdVar8 + uVar11 * 8);
                uVar17 = *(ulong *)(pdVar7 + uVar11 * 8);
                if (*pcVar6 == '\0') {
                  *pcVar6 = '\x01';
                }
                else {
                  uVar17 = uVar17 ^ *(ulong *)(pcVar6 + 8);
                }
                *(ulong *)(pcVar6 + 8) = uVar17;
                uVar11 = uVar11 + 1;
                uVar13 = uVar12;
              } while (uVar12 != uVar11);
            }
          }
          else if (uVar11 < uVar12) {
            uVar18 = 0;
            do {
              if ((uVar17 >> (uVar18 & 0x3f) & 1) != 0) {
                pcVar6 = *(char **)(pdVar8 + uVar18 * 8 + uVar11 * 8);
                if (*pcVar6 == '\0') {
                  *(ulong *)(pcVar6 + 8) = *(ulong *)(pdVar7 + uVar18 * 8 + uVar11 * 8);
                  *pcVar6 = '\x01';
                }
                else {
                  *(ulong *)(pcVar6 + 8) =
                       *(ulong *)(pcVar6 + 8) ^ *(ulong *)(pdVar7 + uVar18 * 8 + uVar11 * 8);
                }
              }
              uVar18 = uVar18 + 1;
              uVar13 = uVar12;
            } while (uVar12 - uVar11 != uVar18);
          }
        }
        uVar10 = uVar10 + 1;
        uVar11 = uVar13;
      } while (uVar10 != count + 0x3f >> 6);
      return;
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      return;
    }
    if (count == 0) {
      return;
    }
    puVar2 = (ulong *)input->data;
    pbVar3 = *(byte **)states->data;
    bVar9 = *pbVar3;
    do {
      uVar11 = *puVar2;
      if ((bVar9 & 1) == 0) {
        *pbVar3 = 1;
        bVar9 = 1;
      }
      else {
        uVar11 = uVar11 ^ *(ulong *)(pbVar3 + 8);
      }
      *(ulong *)(pbVar3 + 8) = uVar11;
      count = count - 1;
    } while (count != 0);
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  Vector::ToUnifiedFormat(input,count,&local_b8);
  Vector::ToUnifiedFormat(states,count,&local_70);
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      psVar4 = (local_b8.sel)->sel_vector;
      psVar5 = (local_70.sel)->sel_vector;
      iVar14 = 0;
      do {
        iVar15 = iVar14;
        if (psVar4 != (sel_t *)0x0) {
          iVar15 = (idx_t)psVar4[iVar14];
        }
        iVar16 = iVar14;
        if (psVar5 != (sel_t *)0x0) {
          iVar16 = (idx_t)psVar5[iVar14];
        }
        pcVar6 = *(char **)(local_70.data + iVar16 * 8);
        uVar11 = *(ulong *)(local_b8.data + iVar15 * 8);
        if (*pcVar6 == '\0') {
          *pcVar6 = '\x01';
        }
        else {
          uVar11 = uVar11 ^ *(ulong *)(pcVar6 + 8);
        }
        *(ulong *)(pcVar6 + 8) = uVar11;
        iVar14 = iVar14 + 1;
      } while (count != iVar14);
    }
  }
  else if (count != 0) {
    psVar4 = (local_b8.sel)->sel_vector;
    psVar5 = (local_70.sel)->sel_vector;
    iVar14 = 0;
    do {
      iVar15 = iVar14;
      if (psVar4 != (sel_t *)0x0) {
        iVar15 = (idx_t)psVar4[iVar14];
      }
      iVar16 = iVar14;
      if (psVar5 != (sel_t *)0x0) {
        iVar16 = (idx_t)psVar5[iVar14];
      }
      if ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar15 >> 6]
           >> (iVar15 & 0x3f) & 1) != 0) {
        pcVar6 = *(char **)(local_70.data + iVar16 * 8);
        if (*pcVar6 == '\0') {
          *(ulong *)(pcVar6 + 8) = *(ulong *)(local_b8.data + iVar15 * 8);
          *pcVar6 = '\x01';
        }
        else {
          *(ulong *)(pcVar6 + 8) = *(ulong *)(pcVar6 + 8) ^ *(ulong *)(local_b8.data + iVar15 * 8);
        }
      }
      iVar14 = iVar14 + 1;
    } while (count != iVar14);
  }
  if (local_70.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}